

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

Vec4 glcts::SetLum(Vec4 *cbase,Vec4 *clum)

{
  float fVar1;
  Vector<float,_4> *res_4;
  int i;
  long lVar2;
  float *in_RDI;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec4 VVar7;
  Vec4 VVar8;
  Vec4 color;
  Vec4 vllum;
  Vector<float,_4> res_1;
  Vector<float,_4> res_2;
  Vector<float,_4> res_3;
  
  fVar5 = cbase->m_data[1];
  fVar6 = cbase->m_data[0];
  fVar1 = cbase->m_data[2];
  fVar4 = clum->m_data[2] * 0.11 + clum->m_data[0] * 0.3 + clum->m_data[1] * 0.59;
  lVar2 = 0;
  do {
    vllum.m_data[lVar2] = fVar4 - (fVar1 * 0.11 + fVar6 * 0.3 + fVar5 * 0.59);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  color.m_data[0] = 0.0;
  color.m_data[1] = 0.0;
  color.m_data[2] = 0.0;
  color.m_data[3] = 0.0;
  lVar2 = 0;
  do {
    color.m_data[lVar2] = cbase->m_data[lVar2] + vllum.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    vllum.m_data[lVar2] = fVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar5 = (float)(~-(uint)(color.m_data[0] <= color.m_data[1]) & (uint)color.m_data[1] |
                 -(uint)(color.m_data[0] <= color.m_data[1]) & (uint)color.m_data[0]);
  uVar3 = -(uint)(fVar5 <= color.m_data[2]);
  fVar5 = (float)(~uVar3 & (uint)color.m_data[2] | uVar3 & (uint)fVar5);
  if (0.0 <= fVar5) {
    fVar5 = (float)(~-(uint)(color.m_data[1] <= color.m_data[0]) & (uint)color.m_data[1] |
                   (uint)color.m_data[0] & -(uint)(color.m_data[1] <= color.m_data[0]));
    uVar3 = -(uint)(color.m_data[2] <= fVar5);
    fVar6 = (float)(~uVar3 & (uint)color.m_data[2] | uVar3 & (uint)fVar5);
    if (fVar6 <= 1.0) {
      *(undefined8 *)in_RDI = color.m_data._0_8_;
      *(undefined8 *)(in_RDI + 2) = color.m_data._8_8_;
      VVar8.m_data[2] = fVar6;
      VVar8.m_data[0] = color.m_data[0];
      VVar8.m_data[1] = color.m_data[1];
      VVar8.m_data[3] = 0.0;
      return (Vec4)VVar8.m_data;
    }
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = color.m_data[lVar2] - vllum.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      res_2.m_data[lVar2] = res_1.m_data[lVar2] * (1.0 - fVar4);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    fVar6 = fVar6 - fVar4;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      res_3.m_data[lVar2] = res_2.m_data[lVar2] / fVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    in_RDI[0] = 0.0;
    in_RDI[1] = 0.0;
    in_RDI[2] = 0.0;
    in_RDI[3] = 0.0;
    lVar2 = 0;
    do {
      fVar5 = vllum.m_data[lVar2] + res_3.m_data[lVar2];
      in_RDI[lVar2] = fVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    res_1.m_data[2] = 0.0;
    res_1.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = color.m_data[lVar2] - vllum.m_data[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    res_2.m_data[0] = 0.0;
    res_2.m_data[1] = 0.0;
    res_2.m_data[2] = 0.0;
    res_2.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      res_2.m_data[lVar2] = res_1.m_data[lVar2] * fVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    res_3.m_data[2] = 0.0;
    res_3.m_data[3] = 0.0;
    lVar2 = 0;
    do {
      fVar6 = res_2.m_data[lVar2] / (fVar4 - fVar5);
      res_3.m_data[lVar2] = fVar6;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    in_RDI[0] = 0.0;
    in_RDI[1] = 0.0;
    in_RDI[2] = 0.0;
    in_RDI[3] = 0.0;
    lVar2 = 0;
    do {
      fVar5 = vllum.m_data[lVar2] + res_3.m_data[lVar2];
      in_RDI[lVar2] = fVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  VVar7.m_data[1] = 0.0;
  VVar7.m_data[0] = fVar5;
  VVar7.m_data[2] = fVar6;
  VVar7.m_data[3] = 0.0;
  return (Vec4)VVar7.m_data;
}

Assistant:

static tcu::Vec4 SetLum(const tcu::Vec4& cbase, const tcu::Vec4& clum)
{
	float	 lbase = Luminance(cbase);
	float	 llum  = Luminance(clum);
	float	 ldiff = llum - lbase;
	tcu::Vec4 color = cbase + tcu::Vec4(ldiff);
	tcu::Vec4 vllum = tcu::Vec4(llum);
	if (MinRGB(color) < 0.0f)
	{
		return vllum + ((color - vllum) * llum) / (llum - MinRGB(color));
	}
	else if (MaxRGB(color) > 1.0f)
	{
		return vllum + ((color - vllum) * (1.f - llum)) / (MaxRGB(color) - llum);
	}
	else
	{
		return color;
	}
}